

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMarkAsAdvancedCommand.h
# Opt level: O0

cmCommand * __thiscall cmMarkAsAdvancedCommand::Clone(cmMarkAsAdvancedCommand *this)

{
  cmCommand *this_00;
  cmMarkAsAdvancedCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmMarkAsAdvancedCommand((cmMarkAsAdvancedCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmMarkAsAdvancedCommand;
    }